

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::CCPPass::ReplaceValues(CCPPass *this)

{
  uint32_t id_00;
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  Module *this_00;
  reference ppVar4;
  bool bVar5;
  uint32_t cst_id;
  uint32_t id;
  pair<const_unsigned_int,_unsigned_int> *it;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range2;
  bool changed_ir;
  CCPPass *this_local;
  
  pIVar3 = Pass::context((Pass *)this);
  this_00 = IRContext::module(pIVar3);
  uVar2 = Module::IdBound(this_00);
  bVar5 = this->original_id_bound_ < uVar2;
  __end2 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::begin(&this->values_);
  it = (pair<const_unsigned_int,_unsigned_int> *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(&this->values_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                        &it);
    if (!bVar1) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator*
                       (&__end2);
    uVar2 = ppVar4->first;
    id_00 = ppVar4->second;
    bVar1 = IsVaryingValue(this,id_00);
    if ((!bVar1) && (uVar2 != id_00)) {
      pIVar3 = Pass::context((Pass *)this);
      IRContext::KillNamesAndDecorates(pIVar3,uVar2);
      pIVar3 = Pass::context((Pass *)this);
      bVar1 = IRContext::ReplaceAllUsesWith(pIVar3,uVar2,id_00);
      bVar5 = bVar5 != false || bVar1;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator++(&__end2);
  }
  return bVar5;
}

Assistant:

bool CCPPass::ReplaceValues() {
  // Even if we make no changes to the function's IR, propagation may have
  // created new constants.  Even if those constants cannot be replaced in
  // the IR, the constant definition itself is a change.  To reflect this,
  // we check whether the next ID to be given by the module is different than
  // the original bound ID. If that happens, new instructions were added to the
  // module during propagation.
  //
  // See https://github.com/KhronosGroup/SPIRV-Tools/issues/3636 and
  // https://github.com/KhronosGroup/SPIRV-Tools/issues/3991 for details.
  bool changed_ir = (context()->module()->IdBound() > original_id_bound_);

  for (const auto& it : values_) {
    uint32_t id = it.first;
    uint32_t cst_id = it.second;
    if (!IsVaryingValue(cst_id) && id != cst_id) {
      context()->KillNamesAndDecorates(id);
      changed_ir |= context()->ReplaceAllUsesWith(id, cst_id);
    }
  }

  return changed_ir;
}